

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  GREG *G;
  Node *node;
  char *pcVar3;
  long lVar4;
  code *pcVar5;
  
  output = _stdout;
  input = _stdin;
  lineNumber = 1;
  fileName = "<stdin>";
  do {
    while( true ) {
      iVar2 = getopt(argc,argv,"Vho:v");
      if (iVar2 < 0x6f) goto LAB_001029e8;
      if (iVar2 == 0x6f) break;
      if (iVar2 != 0x76) goto LAB_00102bcc;
      verboseFlag = verboseFlag + 1;
    }
    output = (FILE *)fopen(_optarg,"w");
  } while ((FILE *)output != (FILE *)0x0);
  main_cold_1();
  iVar2 = extraout_EAX;
LAB_001029e8:
  iVar1 = _optind;
  if (iVar2 == -1) {
    G = (GREG *)calloc(1,0x68);
    if (argc == iVar1) {
      iVar2 = yyparse_from(G,yy_grammar);
      pcVar5 = (code *)argv;
      if (iVar2 == 0) {
LAB_00102bb8:
        yyerror(G,"syntax error");
LAB_00102bc7:
        main_cold_3();
        argv = (char **)pcVar5;
LAB_00102bcc:
        main_cold_4();
        iVar2 = printf("%s version %d.%d.%d\n",argv,0,4,4);
        return iVar2;
      }
    }
    else {
      lVar4 = 0;
      pcVar5 = yy_grammar;
      do {
        pcVar3 = argv[iVar1 + lVar4];
        if ((*pcVar3 == '-') && (pcVar3[1] == '\0')) {
          input = _stdin;
          pcVar3 = "<stdin>";
        }
        else {
          input = (FILE *)fopen(pcVar3,"r");
          pcVar3 = argv[iVar1 + lVar4];
          if ((FILE *)input == (FILE *)0x0) goto LAB_00102bc7;
        }
        lineNumber = 1;
        fileName = pcVar3;
        iVar2 = yyparse_from(G,yy_grammar);
        if (iVar2 == 0) goto LAB_00102bb8;
        if (input != _stdin) {
          fclose((FILE *)input);
        }
        lVar4 = lVar4 + 1;
      } while (argc - iVar1 != (int)lVar4);
    }
    yydeinit(G);
    free(G);
    node = rules;
    if (rules != (Node *)0x0 && verboseFlag != 0) {
      do {
        Rule_print(node);
        node = (node->rule).next;
      } while (node != (Node *)0x0);
    }
    Rule_compile_c_header();
    for (; headers != (Header *)0x0; headers = headers->next) {
      fprintf((FILE *)output,"%s\n",headers->text);
    }
    if (rules != (Node *)0x0) {
      Rule_compile_c(rules);
    }
    if (trailer != (char *)0x0) {
      fprintf((FILE *)output,"%s\n");
    }
    return 0;
  }
  if (iVar2 != 0x56) {
    if (iVar2 != 0x68) goto LAB_00102bcc;
    main_cold_2();
  }
  pcVar3 = __xpg_basename(*argv);
  version(pcVar3);
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
  GREG *G;
  Node *n;
  int   c;

  output= stdout;
  input= stdin;
  lineNumber= 1;
  fileName= "<stdin>";

  while (-1 != (c= getopt(argc, argv, "Vho:v")))
    {
      switch (c)
	{
	case 'V':
	  version(basename(argv[0]));
	  exit(0);

	case 'h':
	  usage(basename(argv[0]));
	  break;

	case 'o':
	  if (!(output= fopen(optarg, "w")))
	    {
	      perror(optarg);
	      exit(1);
	    }
	  break;

	case 'v':
	  verboseFlag++;
	  break;

	default:
	  fprintf(stderr, "for usage try: %s -h\n", argv[0]);
	  exit(1);
	}
    }
  argc -= optind;
  argv += optind;

  G = yyparse_new(NULL);
#ifdef YY_DEBUG
  if (verboseFlag > 0) {
    G->debug = DEBUG_PARSE;
    if (verboseFlag > 1)
      G->debug = DEBUG_PARSE + DEBUG_VERBOSE;
  }
#endif
  if (argc)
    {
      for (;  argc;  --argc, ++argv)
	{
	  if (!strcmp(*argv, "-"))
	    {
	      input= stdin;
	      fileName= "<stdin>";
	    }
	  else
	    {
	      if (!(input= fopen(*argv, "r")))
		{
		  perror(*argv);
		  exit(1);
		}
	      fileName= *argv;
	    }
	  lineNumber= 1;
	  if (!yyparse(G))
	    yyerror(G, "syntax error");
	  if (input != stdin)
	    fclose(input);
	}
    }
  else
    if (!yyparse(G))
      yyerror(G, "syntax error");
  yyparse_free(G);

  if (verboseFlag)
    for (n= rules;  n;  n= n->any.next)
      Rule_print(n);

  Rule_compile_c_header();

  for (; headers;  headers= headers->next)
    fprintf(output, "%s\n", headers->text);

  if (rules)
    Rule_compile_c(rules);

  if (trailer)
    fprintf(output, "%s\n", trailer);

  return 0;
}